

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

boolean corpse_chance(monst *mon,monst *magr,boolean was_swallowed)

{
  permonst *pm;
  byte bVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  obj *poVar5;
  char local_138 [8];
  char kbuf [256];
  int tmp;
  int i;
  permonst *mdat;
  boolean was_swallowed_local;
  monst *magr_local;
  monst *mon_local;
  
  pm = mon->data;
  if (((pm == mons + 0xea) || (pm->mlet == '&')) || (pm == mons + 0xdb)) {
    if (((viz_array[mon->my][mon->mx] & 2U) != 0) && (was_swallowed == '\0')) {
      pcVar4 = Monnam(mon);
      pcVar4 = s_suffix(pcVar4);
      pline("%s body crumbles into dust.",pcVar4);
    }
    mon_local._7_1_ = 0;
  }
  else {
    kbuf[0xfc] = '\0';
    kbuf[0xfd] = '\0';
    kbuf[0xfe] = '\0';
    kbuf[0xff] = '\0';
    for (; (int)kbuf._252_4_ < 6; kbuf._252_4_ = kbuf._252_4_ + 1) {
      if (pm->mattk[(int)kbuf._252_4_].aatyp == '\x0e') {
        if (pm->mattk[(int)kbuf._252_4_].damn == '\0') {
          if (pm->mattk[(int)kbuf._252_4_].damd == '\0') {
            kbuf[0xf8] = '\0';
            kbuf[0xf9] = '\0';
            kbuf[0xfa] = '\0';
            kbuf[0xfb] = '\0';
          }
          else {
            kbuf._248_4_ = dice(pm->mlevel + 1,(uint)pm->mattk[(int)kbuf._252_4_].damd);
          }
        }
        else {
          kbuf._248_4_ = dice((uint)pm->mattk[(int)kbuf._252_4_].damn,
                              (uint)pm->mattk[(int)kbuf._252_4_].damd);
        }
        if ((was_swallowed == '\0') || (magr == (monst *)0x0)) {
          pcVar4 = mons_mname(pm);
          pcVar4 = s_suffix(pcVar4);
          sprintf(local_138,"%s explosion",pcVar4);
          killer = local_138;
          killer_format = 0;
          explode((int)mon->mx,(int)mon->my,-1,kbuf._248_4_,'\x14',1);
          return '\0';
        }
        if (magr == &youmonst) {
          pcVar4 = body_part(0x12);
          pline("There is an explosion in your %s!",pcVar4);
          pcVar4 = mons_mname(pm);
          pcVar4 = s_suffix(pcVar4);
          sprintf(local_138,"%s explosion",pcVar4);
          if ((u.uprops[0x33].intrinsic != 0) || (u.uprops[0x33].extrinsic != 0)) {
            kbuf._248_4_ = (kbuf._248_4_ + 1) / 2;
          }
          losehp(kbuf._248_4_,local_138,0);
          return '\0';
        }
        if (flags.soundok != '\0') {
          You_hear("an explosion.");
        }
        magr->mhp = magr->mhp - kbuf._248_4_;
        if (magr->mhp < 1) {
          mondied(magr);
        }
        if (0 < magr->mhp) {
          if (magr->wormno == '\0') {
            if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_0024b9bc;
            if ((u.uprops[0x1e].intrinsic != 0) ||
               (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
              if (ublindf == (obj *)0x0) {
                return '\0';
              }
              if (ublindf->oartifact != '\x1d') {
                return '\0';
              }
            }
            if (((u.uprops[0x40].intrinsic == 0) && (u.uprops[0x40].extrinsic == 0)) &&
               (((youmonst.data)->mflags3 & 0x100) == 0)) {
              return '\0';
            }
            if ((magr->data->mflags3 & 0x200) == 0) {
              return '\0';
            }
            bVar1 = viz_array[magr->my][magr->mx] & 1;
          }
          else {
            bVar1 = worm_known(level,magr);
          }
          if (bVar1 == 0) {
            return '\0';
          }
LAB_0024b9bc:
          if ((((*(uint *)&magr->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
             ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) {
            return '\0';
          }
          if ((*(uint *)&magr->field_0x60 >> 7 & 1) != 0) {
            return '\0';
          }
          if ((*(uint *)&magr->field_0x60 >> 9 & 1) == 0) {
            if (((byte)u._1052_1_ >> 5 & 1) == 0) {
              pcVar4 = Monnam(magr);
              pline("%s seems to have indigestion.",pcVar4);
              return '\0';
            }
            return '\0';
          }
          return '\0';
        }
        if (magr->wormno == '\0') {
          if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_0024b5f1;
          if (((((u.uprops[0x1e].intrinsic == 0) &&
                (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
              ((u.uprops[0x40].intrinsic != 0 ||
               ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
             ((magr->data->mflags3 & 0x200) != 0)) {
            bVar1 = viz_array[magr->my][magr->mx] & 1;
            goto joined_r0x0024b5eb;
          }
        }
        else {
          bVar1 = worm_known(level,magr);
joined_r0x0024b5eb:
          if (bVar1 != 0) {
LAB_0024b5f1:
            if ((((((*(uint *)&magr->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0))
                 || (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)
                ) && ((((*(uint *)&magr->field_0x60 >> 7 & 1) == 0 &&
                       ((*(uint *)&magr->field_0x60 >> 9 & 1) == 0)) &&
                      (((byte)u._1052_1_ >> 5 & 1) == 0)))) goto LAB_0024b841;
          }
        }
        if (((((magr->data->mflags1 & 0x10000) != 0) ||
             ((poVar5 = which_armor(magr,4), poVar5 != (obj *)0x0 &&
              (poVar5 = which_armor(magr,4), poVar5->otyp == 0x4f)))) ||
            (((((u.uprops[0x1e].intrinsic == 0 &&
                (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
               (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
                ((((u.uprops[0x19].intrinsic == 0 &&
                   ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
                  (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
              (u.uprops[0x19].blocked != 0)) &&
             (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
              (iVar3 = dist2((int)magr->mx,(int)magr->my,(int)u.ux,(int)u.uy), 0x40 < iVar3)))))) &&
           (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
            (bVar2 = match_warn_of_mon(magr), bVar2 == '\0')))) {
          return '\0';
        }
LAB_0024b841:
        pcVar4 = Monnam(magr);
        pline("%s rips open!",pcVar4);
        return '\0';
      }
    }
    bVar2 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
    if ((bVar2 == '\0') &&
       ((((*(uint *)&(level->flags).field_0x8 >> 0x10 & 1) == 0 || ((pm->mflags2 & 2) == 0)) ||
        (iVar3 = rn2(3), iVar3 == 0)))) {
      if (((((pm->msize < 3) && (pm != mons + 0x154)) && (pm->mlet != '7')) &&
          ((pm <= &mons[0x158].field_0x3f || ((permonst *)((long)&mons[0x168].mname + 1) <= pm))))
         && ((pm != mons + 0x144 && ((pm != mons + 0x146 && (pm != mons + 0x145)))))) {
        iVar3 = rn2(((pm->geno & 7) < 2) + 2 + (uint)(pm->msize == '\0'));
        mon_local._7_1_ = (iVar3 != 0 ^ 0xffU) & 1;
      }
      else {
        mon_local._7_1_ = 1;
      }
    }
    else {
      mon_local._7_1_ = 0;
    }
  }
  return mon_local._7_1_;
}

Assistant:

boolean corpse_chance(struct monst *mon, 
		      struct monst *magr,	/* killer, if swallowed */
		      boolean was_swallowed)	/* digestion */
{
	const struct permonst *mdat = mon->data;
	int i, tmp;
	char kbuf[BUFSZ];

	if (mdat == &mons[PM_VLAD_THE_IMPALER] || mdat->mlet == S_LICH ||
	    mdat == &mons[PM_DISINTEGRATOR]) {
	    if (cansee(mon->mx, mon->my) && !was_swallowed)
		pline("%s body crumbles into dust.", s_suffix(Monnam(mon)));
	    return FALSE;
	}

	/* Gas spores always explode upon death */
	for (i = 0; i < NATTK; i++) {
	    if (mdat->mattk[i].aatyp == AT_BOOM) {
		if (mdat->mattk[i].damn)
		    tmp = dice((int)mdat->mattk[i].damn,
				(int)mdat->mattk[i].damd);
		else if (mdat->mattk[i].damd)
		    tmp = dice((int)mdat->mlevel+1, (int)mdat->mattk[i].damd);
		else tmp = 0;
		if (was_swallowed && magr) {
		    if (magr == &youmonst) {
			pline("There is an explosion in your %s!",
			      body_part(STOMACH));
			sprintf(kbuf, "%s explosion",
				s_suffix(mons_mname(mdat)));
			if (Half_physical_damage) tmp = (tmp+1) / 2;
			losehp(tmp, kbuf, KILLED_BY_AN);
		    } else {
			if (flags.soundok) You_hear("an explosion.");
			magr->mhp -= tmp;
			if (magr->mhp < 1) mondied(magr);
			if (magr->mhp < 1) { /* maybe lifesaved */
			    if (canspotmon(level, magr))
				pline("%s rips open!", Monnam(magr));
			} else if (canseemon(level, magr))
			    pline("%s seems to have indigestion.",
				  Monnam(magr));
		    }

		    return FALSE;
		}

		sprintf(kbuf, "%s explosion", s_suffix(mons_mname(mdat)));
		killer = kbuf;
		killer_format = KILLED_BY_AN;
		explode(mon->mx, mon->my, -1, tmp, MON_EXPLODE, EXPL_NOXIOUS);
		return FALSE;
	    }
	}

	/* must duplicate this below check in xkilled() since it results in
	 * creating no objects as well as no corpse
	 */
	if (LEVEL_SPECIFIC_NOCORPSE(mdat))
		return FALSE;

	if (bigmonst(mdat) || mdat == &mons[PM_LIZARD]
		   || is_golem(mdat)
		   || is_mplayer(mdat)
		   || is_rider(mdat))
		return TRUE;
	return (boolean) (!rn2((int)
		(2 + ((int)(mdat->geno & G_FREQ)<2) + verysmall(mdat))));
}